

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22652::
ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTIteratorTest_I4AndTwoLeavesReverseScan_Test
          (ARTIteratorTest_I4AndTwoLeavesReverseScan_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, I4AndTwoLeavesReverseScan) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  auto b = db.test_only_iterator();
  b.last();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 1);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[1]));
  }
  b.prior();
  UNODB_EXPECT_TRUE(b.valid());
  {
    UNODB_EXPECT_EQ(decode(b.get_key()), 0);
    UNODB_EXPECT_TRUE(
        std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  }
  b.prior();
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}